

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct::load_model(InnerProduct *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  void *local_348;
  int *local_340;
  long *local_328;
  void *local_300;
  int *local_2f8;
  undefined8 local_2f0;
  undefined4 local_2e8;
  long *local_2e0;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined8 local_2c0;
  void *local_2b8;
  int *local_2b0;
  undefined8 local_2a8;
  undefined4 local_2a0;
  long *local_298;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined4 local_280;
  undefined8 local_278;
  void *local_260;
  int *local_258;
  undefined8 local_250;
  undefined4 local_248;
  long *local_240;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 local_22c;
  undefined4 local_228;
  undefined8 local_220;
  long *local_218;
  int local_204;
  void **local_200;
  void **local_1f0;
  void **local_1e0;
  void **local_1d0;
  int local_1c0;
  undefined4 local_1bc;
  void **local_1b8;
  void **local_1b0;
  void **local_1a8;
  int local_1a0;
  undefined4 local_19c;
  void **local_198;
  void **local_190;
  void **local_188;
  int local_180;
  undefined4 local_17c;
  void **local_178;
  void **local_170;
  void **local_168;
  int local_160;
  undefined4 local_15c;
  void **local_158;
  void **local_150;
  void **local_148;
  long *local_140;
  long *local_138;
  int local_130;
  undefined4 local_12c;
  void **local_128;
  int local_120;
  undefined4 local_11c;
  void **local_118;
  int local_110;
  undefined4 local_10c;
  void **local_108;
  int local_100;
  undefined4 local_fc;
  void **local_f8;
  int local_e0;
  undefined4 local_dc;
  void **local_d8;
  int local_c0;
  undefined4 local_bc;
  void **local_b8;
  int local_a0;
  undefined4 local_9c;
  void **local_98;
  int local_80;
  undefined4 local_7c;
  void **local_78;
  void *local_30;
  void *local_28;
  void *local_20;
  void *local_18;
  long *local_10;
  long *local_8;
  
  local_218 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(&local_260,in_RSI,*(undefined4 *)(in_RDI + 0xd8),0);
  ppvVar2 = (void **)(in_RDI + 0x130);
  local_158 = &local_260;
  local_150 = ppvVar2;
  if (ppvVar2 != local_158) {
    if (local_258 != (int *)0x0) {
      local_15c = 1;
      LOCK();
      local_160 = *local_258;
      *local_258 = *local_258 + 1;
      UNLOCK();
    }
    local_128 = ppvVar2;
    if (*(long *)(in_RDI + 0x138) != 0) {
      piVar1 = *(int **)(in_RDI + 0x138);
      local_12c = 0xffffffff;
      LOCK();
      local_130 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_130 == 1) {
        if (*(long *)(in_RDI + 0x150) == 0) {
          local_18 = *ppvVar2;
          if (local_18 != (void *)0x0) {
            free(local_18);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x150) + 0x18))(*(long **)(in_RDI + 0x150),*ppvVar2);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x140) = 0;
    *(undefined4 *)(in_RDI + 0x148) = 0;
    *(undefined4 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x15c) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined4 *)(in_RDI + 0x164) = 0;
    *(undefined4 *)(in_RDI + 0x168) = 0;
    *(undefined8 *)(in_RDI + 0x170) = 0;
    *(undefined8 *)(in_RDI + 0x138) = 0;
    *ppvVar2 = *local_158;
    *(void **)(in_RDI + 0x138) = local_158[1];
    *(void **)(in_RDI + 0x140) = local_158[2];
    *(undefined4 *)(in_RDI + 0x148) = *(undefined4 *)(local_158 + 3);
    *(void **)(in_RDI + 0x150) = local_158[4];
    *(undefined4 *)(in_RDI + 0x158) = *(undefined4 *)(local_158 + 5);
    *(undefined4 *)(in_RDI + 0x15c) = *(undefined4 *)((long)local_158 + 0x2c);
    *(undefined4 *)(in_RDI + 0x160) = *(undefined4 *)(local_158 + 6);
    *(undefined4 *)(in_RDI + 0x164) = *(undefined4 *)((long)local_158 + 0x34);
    *(undefined4 *)(in_RDI + 0x168) = *(undefined4 *)(local_158 + 7);
    *(void **)(in_RDI + 0x170) = local_158[8];
  }
  local_200 = &local_260;
  local_148 = ppvVar2;
  local_78 = local_200;
  if (local_258 != (int *)0x0) {
    local_7c = 0xffffffff;
    LOCK();
    local_80 = *local_258;
    *local_258 = *local_258 + -1;
    UNLOCK();
    if (local_80 == 1) {
      if (local_240 == (long *)0x0) {
        if (local_260 != (void *)0x0) {
          free(local_260);
        }
      }
      else {
        (**(code **)(*local_240 + 0x18))(local_240,local_260);
      }
    }
  }
  local_260 = (void *)0x0;
  local_250 = 0;
  local_248 = 0;
  local_238 = 0;
  local_234 = 0;
  local_230 = 0;
  local_22c = 0;
  local_228 = 0;
  local_220 = 0;
  local_258 = (int *)0x0;
  local_138 = (long *)(in_RDI + 0x130);
  bVar3 = true;
  if (*local_138 != 0) {
    bVar3 = *(long *)(in_RDI + 0x170) * (long)*(int *)(in_RDI + 0x168) == 0;
    local_10 = local_138;
  }
  if (bVar3) {
    local_204 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xd4) != 0) {
      (**(code **)(*local_218 + 0x10))(&local_2b8,local_218,*(undefined4 *)(in_RDI + 0xd0),1);
      ppvVar2 = (void **)(in_RDI + 0x178);
      local_178 = &local_2b8;
      local_170 = ppvVar2;
      if (ppvVar2 != local_178) {
        if (local_2b0 != (int *)0x0) {
          local_17c = 1;
          LOCK();
          local_180 = *local_2b0;
          *local_2b0 = *local_2b0 + 1;
          UNLOCK();
        }
        local_118 = ppvVar2;
        if (*(long *)(in_RDI + 0x180) != 0) {
          piVar1 = *(int **)(in_RDI + 0x180);
          local_11c = 0xffffffff;
          LOCK();
          local_120 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_120 == 1) {
            if (*(long *)(in_RDI + 0x198) == 0) {
              local_20 = *ppvVar2;
              if (local_20 != (void *)0x0) {
                free(local_20);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x198) + 0x18))(*(long **)(in_RDI + 0x198),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x188) = 0;
        *(undefined4 *)(in_RDI + 400) = 0;
        *(undefined4 *)(in_RDI + 0x1a0) = 0;
        *(undefined4 *)(in_RDI + 0x1a4) = 0;
        *(undefined4 *)(in_RDI + 0x1a8) = 0;
        *(undefined4 *)(in_RDI + 0x1ac) = 0;
        *(undefined4 *)(in_RDI + 0x1b0) = 0;
        *(undefined8 *)(in_RDI + 0x1b8) = 0;
        *(undefined8 *)(in_RDI + 0x180) = 0;
        *ppvVar2 = *local_178;
        *(void **)(in_RDI + 0x180) = local_178[1];
        *(void **)(in_RDI + 0x188) = local_178[2];
        *(undefined4 *)(in_RDI + 400) = *(undefined4 *)(local_178 + 3);
        *(void **)(in_RDI + 0x198) = local_178[4];
        *(undefined4 *)(in_RDI + 0x1a0) = *(undefined4 *)(local_178 + 5);
        *(undefined4 *)(in_RDI + 0x1a4) = *(undefined4 *)((long)local_178 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1a8) = *(undefined4 *)(local_178 + 6);
        *(undefined4 *)(in_RDI + 0x1ac) = *(undefined4 *)((long)local_178 + 0x34);
        *(undefined4 *)(in_RDI + 0x1b0) = *(undefined4 *)(local_178 + 7);
        *(void **)(in_RDI + 0x1b8) = local_178[8];
      }
      local_1f0 = &local_2b8;
      local_168 = ppvVar2;
      local_98 = local_1f0;
      if (local_2b0 != (int *)0x0) {
        local_9c = 0xffffffff;
        LOCK();
        local_a0 = *local_2b0;
        *local_2b0 = *local_2b0 + -1;
        UNLOCK();
        if (local_a0 == 1) {
          if (local_298 == (long *)0x0) {
            if (local_2b8 != (void *)0x0) {
              free(local_2b8);
            }
          }
          else {
            (**(code **)(*local_298 + 0x18))(local_298,local_2b8);
          }
        }
      }
      local_2b8 = (void *)0x0;
      local_2a8 = 0;
      local_2a0 = 0;
      local_290 = 0;
      local_28c = 0;
      local_288 = 0;
      local_284 = 0;
      local_280 = 0;
      local_278 = 0;
      local_2b0 = (int *)0x0;
      local_140 = (long *)(in_RDI + 0x178);
      bVar3 = true;
      if (*local_140 != 0) {
        bVar3 = *(long *)(in_RDI + 0x1b8) * (long)*(int *)(in_RDI + 0x1b0) == 0;
        local_8 = local_140;
      }
      if (bVar3) {
        return -100;
      }
    }
    if (*(int *)(in_RDI + 0xdc) != 0) {
      (**(code **)(*local_218 + 0x10))(&local_300,local_218,*(undefined4 *)(in_RDI + 0xd0),1);
      ppvVar2 = (void **)(in_RDI + 0x1c0);
      local_198 = &local_300;
      local_190 = ppvVar2;
      if (ppvVar2 != local_198) {
        if (local_2f8 != (int *)0x0) {
          local_19c = 1;
          LOCK();
          local_1a0 = *local_2f8;
          *local_2f8 = *local_2f8 + 1;
          UNLOCK();
        }
        local_108 = ppvVar2;
        if (*(long *)(in_RDI + 0x1c8) != 0) {
          piVar1 = *(int **)(in_RDI + 0x1c8);
          local_10c = 0xffffffff;
          LOCK();
          local_110 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_110 == 1) {
            if (*(long *)(in_RDI + 0x1e0) == 0) {
              local_28 = *ppvVar2;
              if (local_28 != (void *)0x0) {
                free(local_28);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1e0) + 0x18))(*(long **)(in_RDI + 0x1e0),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x1d0) = 0;
        *(undefined4 *)(in_RDI + 0x1d8) = 0;
        *(undefined4 *)(in_RDI + 0x1e8) = 0;
        *(undefined4 *)(in_RDI + 0x1ec) = 0;
        *(undefined4 *)(in_RDI + 0x1f0) = 0;
        *(undefined4 *)(in_RDI + 500) = 0;
        *(undefined4 *)(in_RDI + 0x1f8) = 0;
        *(undefined8 *)(in_RDI + 0x200) = 0;
        *(undefined8 *)(in_RDI + 0x1c8) = 0;
        *ppvVar2 = *local_198;
        *(void **)(in_RDI + 0x1c8) = local_198[1];
        *(void **)(in_RDI + 0x1d0) = local_198[2];
        *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_198 + 3);
        *(void **)(in_RDI + 0x1e0) = local_198[4];
        *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_198 + 5);
        *(undefined4 *)(in_RDI + 0x1ec) = *(undefined4 *)((long)local_198 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1f0) = *(undefined4 *)(local_198 + 6);
        *(undefined4 *)(in_RDI + 500) = *(undefined4 *)((long)local_198 + 0x34);
        *(undefined4 *)(in_RDI + 0x1f8) = *(undefined4 *)(local_198 + 7);
        *(void **)(in_RDI + 0x200) = local_198[8];
      }
      local_1e0 = &local_300;
      local_188 = ppvVar2;
      local_b8 = local_1e0;
      if (local_2f8 != (int *)0x0) {
        local_bc = 0xffffffff;
        LOCK();
        local_c0 = *local_2f8;
        *local_2f8 = *local_2f8 + -1;
        UNLOCK();
        if (local_c0 == 1) {
          if (local_2e0 == (long *)0x0) {
            if (local_300 != (void *)0x0) {
              free(local_300);
            }
          }
          else {
            (**(code **)(*local_2e0 + 0x18))(local_2e0,local_300);
          }
        }
      }
      local_300 = (void *)0x0;
      local_2f0 = 0;
      local_2e8 = 0;
      local_2d8 = 0;
      local_2d4 = 0;
      local_2d0 = 0;
      local_2cc = 0;
      local_2c8 = 0;
      local_2c0 = 0;
      local_2f8 = (int *)0x0;
      (**(code **)(*local_218 + 0x10))(&local_348,local_218,1);
      ppvVar2 = (void **)(in_RDI + 0x208);
      local_1b8 = &local_348;
      local_1b0 = ppvVar2;
      if (ppvVar2 != local_1b8) {
        if (local_340 != (int *)0x0) {
          local_1bc = 1;
          LOCK();
          local_1c0 = *local_340;
          *local_340 = *local_340 + 1;
          UNLOCK();
        }
        local_f8 = ppvVar2;
        if (*(long *)(in_RDI + 0x210) != 0) {
          piVar1 = *(int **)(in_RDI + 0x210);
          local_fc = 0xffffffff;
          LOCK();
          local_100 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_100 == 1) {
            if (*(long *)(in_RDI + 0x228) == 0) {
              local_30 = *ppvVar2;
              if (local_30 != (void *)0x0) {
                free(local_30);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x228) + 0x18))(*(long **)(in_RDI + 0x228),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x218) = 0;
        *(undefined4 *)(in_RDI + 0x220) = 0;
        *(undefined4 *)(in_RDI + 0x230) = 0;
        *(undefined4 *)(in_RDI + 0x234) = 0;
        *(undefined4 *)(in_RDI + 0x238) = 0;
        *(undefined4 *)(in_RDI + 0x23c) = 0;
        *(undefined4 *)(in_RDI + 0x240) = 0;
        *(undefined8 *)(in_RDI + 0x248) = 0;
        *(undefined8 *)(in_RDI + 0x210) = 0;
        *ppvVar2 = *local_1b8;
        *(void **)(in_RDI + 0x210) = local_1b8[1];
        *(void **)(in_RDI + 0x218) = local_1b8[2];
        *(undefined4 *)(in_RDI + 0x220) = *(undefined4 *)(local_1b8 + 3);
        *(void **)(in_RDI + 0x228) = local_1b8[4];
        *(undefined4 *)(in_RDI + 0x230) = *(undefined4 *)(local_1b8 + 5);
        *(undefined4 *)(in_RDI + 0x234) = *(undefined4 *)((long)local_1b8 + 0x2c);
        *(undefined4 *)(in_RDI + 0x238) = *(undefined4 *)(local_1b8 + 6);
        *(undefined4 *)(in_RDI + 0x23c) = *(undefined4 *)((long)local_1b8 + 0x34);
        *(undefined4 *)(in_RDI + 0x240) = *(undefined4 *)(local_1b8 + 7);
        *(void **)(in_RDI + 0x248) = local_1b8[8];
      }
      local_1d0 = &local_348;
      if (local_340 != (int *)0x0) {
        local_dc = 0xffffffff;
        LOCK();
        local_e0 = *local_340;
        *local_340 = *local_340 + -1;
        UNLOCK();
        if (local_e0 == 1) {
          local_1a8 = ppvVar2;
          local_d8 = local_1d0;
          if (local_328 == (long *)0x0) {
            if (local_348 != (void *)0x0) {
              free(local_348);
            }
          }
          else {
            (**(code **)(*local_328 + 0x18))(local_328,local_348);
          }
        }
      }
    }
    local_204 = 0;
  }
  return local_204;
}

Assistant:

int InnerProduct::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term)
    {
        weight_data_int8_scales = mb.load(num_output, 1);
        bottom_blob_int8_scales = mb.load(1, 1);
    }
#endif // NCNN_INT8

    return 0;
}